

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
common::
make_map<int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>
::make_map(make_map<int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>
           *this,int *key,
          vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>
          *val)

{
  _Rb_tree_header *p_Var1;
  mapped_type *this_00;
  
  p_Var1 = &(this->map)._M_t._M_impl.super__Rb_tree_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = std::
            map<int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>_>_>
            ::operator[](&this->map,key);
  std::
  vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>
  ::operator=(this_00,val);
  return;
}

Assistant:

make_map(K const& key, V const& val) {
            map[key] = val;
        }